

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

UnqualifiedName * __thiscall
soul::PoolAllocator::allocate<soul::AST::UnqualifiedName,soul::AST::Context&,soul::Identifier>
          (PoolAllocator *this,Context *args,Identifier *args_1)

{
  string *psVar1;
  SourceCodeText *pSVar2;
  PoolItem *pPVar3;
  
  pPVar3 = allocateSpaceForObject(this,0x38);
  psVar1 = args_1->name;
  pPVar3->item = &PTR__ASTObject_00301658;
  *(undefined4 *)&pPVar3->field_0x18 = 0x27;
  pSVar2 = (args->location).sourceCode.object;
  pPVar3[1].size = (size_t)pSVar2;
  if (pSVar2 != (SourceCodeText *)0x0) {
    (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
  }
  pPVar3[1].destructor = (DestructorFn *)(args->location).location.data;
  pPVar3[1].item = args->parentScope;
  *(undefined4 *)&pPVar3[1].field_0x18 = 4;
  pPVar3->item = &PTR__ASTObject_00301b58;
  pPVar3[2].size = (size_t)psVar1;
  pPVar3->destructor =
       allocate<soul::AST::UnqualifiedName,_soul::AST::Context_&,_soul::Identifier>::
       anon_class_1_0_00000001::__invoke;
  return (UnqualifiedName *)&pPVar3->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }